

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool __thiscall
ByteCodeGenerator::NeedScopeObjectForArguments
          (ByteCodeGenerator *this,FuncInfo *funcInfo,ParseNodeFnc *pnodeFnc)

{
  bool bVar1;
  byte local_31;
  byte local_22;
  bool dontNeedScopeObject;
  ParseNodeFnc *pnodeFnc_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = FuncInfo::GetHasHeapArguments(funcInfo);
  local_22 = 0;
  if (bVar1) {
    bVar1 = FuncInfo::GetIsStrictMode(funcInfo);
    if (!bVar1) {
      bVar1 = ParseNodeFnc::HasNonSimpleParameterList(pnodeFnc);
      local_22 = 0;
      if (!bVar1) goto LAB_00b704ef;
    }
    local_22 = 0;
    if ((this->flags & 0x404) == 0) {
      bVar1 = Scope::GetIsObject(funcInfo->paramScope);
      local_22 = 0;
      if (!bVar1) {
        bVar1 = Scope::GetIsObject(funcInfo->bodyScope);
        local_22 = bVar1 ^ 0xff;
      }
    }
  }
LAB_00b704ef:
  bVar1 = FuncInfo::GetHasHeapArguments(funcInfo);
  local_31 = 0;
  if ((bVar1) &&
     ((pnodeFnc->pnodeParams != (ParseNodePtr)0x0 ||
      (local_31 = 0, pnodeFnc->pnodeRest != (ParseNodePtr)0x0)))) {
    local_31 = local_22 & 1 ^ 0xff;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool ByteCodeGenerator::NeedScopeObjectForArguments(FuncInfo *funcInfo, ParseNodeFnc *pnodeFnc) const
{
    // We can avoid creating a scope object with arguments present if:
    bool dontNeedScopeObject =
        // We have arguments, and
        funcInfo->GetHasHeapArguments()
        // Either we are in strict mode, or have strict mode formal semantics from a non-simple parameter list, and
        && (funcInfo->GetIsStrictMode()
            || pnodeFnc->HasNonSimpleParameterList())
        // We're not in eval or event handler, which will force the scope(s) to be objects
        && !(this->flags & (fscrEval | fscrImplicitThis))
        // Neither of the scopes are objects
        && !funcInfo->paramScope->GetIsObject()
        && !funcInfo->bodyScope->GetIsObject();

    return funcInfo->GetHasHeapArguments()
        // Regardless of the conditions above, we won't need a scope object if there aren't any formals.
        && (pnodeFnc->pnodeParams != nullptr || pnodeFnc->pnodeRest != nullptr)
        && !dontNeedScopeObject;
}